

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string_t __thiscall
duckdb::Base64DecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (Base64DecodeOperator *this,string_t input,Vector *result)

{
  undefined8 uVar1;
  ulong uVar2;
  uchar *puVar3;
  string_t sVar4;
  string_t sVar5;
  string_t result_blob;
  undefined1 local_30 [16];
  
  sVar4.value._8_8_ = input.value._0_8_;
  sVar4.value._0_8_ = this;
  uVar2 = duckdb::Blob::FromBase64Size(sVar4);
  local_30 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  puVar3 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    puVar3 = local_30 + 4;
  }
  sVar5.value.pointer.ptr = (char *)sVar4.value._8_8_;
  sVar5.value._0_8_ = this;
  duckdb::Blob::FromBase64(sVar5,puVar3,uVar2);
  uVar1 = local_30._0_8_;
  uVar2 = uVar1 & 0xffffffff;
  if (uVar2 < 0xd) {
    memset(local_30 + 4 + uVar2,0,0xc - uVar2);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_size = Blob::FromBase64Size(input);
		auto result_blob = StringVector::EmptyString(result, result_size);
		Blob::FromBase64(input, data_ptr_cast(result_blob.GetDataWriteable()), result_size);
		result_blob.Finalize();
		return result_blob;
	}